

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O0

void __thiscall
soul::heart::ReadStream::ReadStream
          (ReadStream *this,CodeLocation *l,Expression *dest,InputDeclaration *src)

{
  pool_ptr<soul::heart::Expression> local_40;
  CodeLocation local_38;
  InputDeclaration *local_28;
  InputDeclaration *src_local;
  Expression *dest_local;
  CodeLocation *l_local;
  ReadStream *this_local;
  
  local_28 = src;
  src_local = (InputDeclaration *)dest;
  dest_local = (Expression *)l;
  l_local = (CodeLocation *)this;
  CodeLocation::CodeLocation(&local_38,l);
  pool_ptr<soul::heart::Expression>::pool_ptr<soul::heart::Expression,void>
            (&local_40,(Expression *)src_local);
  Assignment::Assignment(&this->super_Assignment,&local_38,&local_40);
  pool_ptr<soul::heart::Expression>::~pool_ptr(&local_40);
  CodeLocation::~CodeLocation(&local_38);
  (this->super_Assignment).super_Statement.super_Object._vptr_Object =
       (_func_int **)&PTR__ReadStream_00641420;
  pool_ref<soul::heart::InputDeclaration>::pool_ref<soul::heart::InputDeclaration,void>
            (&this->source,local_28);
  pool_ptr<soul::heart::Expression>::pool_ptr(&this->element);
  return;
}

Assistant:

ReadStream (CodeLocation l, Expression& dest, InputDeclaration& src)
            : Assignment (std::move (l), dest), source (src) {}